

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VgaDebugGenerator.cpp
# Opt level: O0

void __thiscall VgaDebugGenerator::Generate_Modules(VgaDebugGenerator *this,ofstream *fout)

{
  bool bVar1;
  reference __in;
  type *module_00;
  type *module;
  type *_;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Module>,_true>
  local_30;
  iterator __end1;
  iterator __begin1;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Module,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Module>_>_>
  *__range1;
  ofstream *fout_local;
  VgaDebugGenerator *this_local;
  
  __end1 = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Module,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Module>_>_>
           ::begin(&this->modules);
  local_30._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Module,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Module>_>_>
       ::end(&this->modules);
  while( true ) {
    bVar1 = std::__detail::operator!=
                      (&__end1.
                        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Module>,_true>
                       ,&local_30);
    if (!bVar1) break;
    __in = std::__detail::
           _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Module>,_false,_true>
           ::operator*(&__end1);
    std::get<0ul,std::__cxx11::string_const,Module>(__in);
    module_00 = std::get<1ul,std::__cxx11::string_const,Module>(__in);
    Generate_Outputs(this,module_00,fout);
    Generate_Assignments(this,module_00,fout);
    Generate_Declaration(this,module_00,fout);
    Generate_Arguments(this,module_00,fout);
    std::__detail::
    _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Module>,_false,_true>
    ::operator++(&__end1);
  }
  return;
}

Assistant:

void VgaDebugGenerator::Generate_Modules(std::ofstream &fout) {
    for (const auto &[_, module] : modules) {
        Generate_Outputs(module, fout);
        Generate_Assignments(module, fout);
        Generate_Declaration(module, fout);
        Generate_Arguments(module, fout);
    }
}